

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall
Lib::Array<unsigned_int>::Array(Array<unsigned_int> *this,initializer_list<unsigned_int> contents)

{
  uint *puVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  uint *res;
  
  sVar2 = contents._M_len;
  this->_vptr_Array = (_func_int **)&PTR_fillInterval_00b53460;
  this->_capacity = sVar2;
  if (sVar2 == 0) {
    puVar1 = (uint *)0x0;
  }
  else {
    uVar4 = sVar2 * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      puVar1 = (uint *)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar4 < 0x11) {
      puVar1 = (uint *)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
    }
    else if (uVar4 < 0x19) {
      puVar1 = (uint *)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
    }
    else if (uVar4 < 0x21) {
      puVar1 = (uint *)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
    }
    else if (uVar4 < 0x31) {
      puVar1 = (uint *)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
    }
    else if (uVar4 < 0x41) {
      puVar1 = (uint *)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
    }
    else {
      puVar1 = (uint *)::operator_new(uVar4,0x10);
    }
    memset(puVar1,0,sVar2 * 4);
  }
  this->_array = puVar1;
  if (sVar2 != 0) {
    puVar1 = this->_array;
    lVar3 = sVar2 << 2;
    uVar4 = 0;
    do {
      puVar1[uVar4 & 0xffffffff] = contents._M_array[uVar4];
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + -4;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

inline
  Array (std::initializer_list<C> contents)
    : Array(contents.size()) 
  {
    auto iter = contents.begin();
    unsigned i = 0;
    while(iter != contents.end()) {
      ASS(i < _capacity)
      _array[i] = std::move(*iter);
      iter++;
      i++;
    }
  }